

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O0

void lace_run_task(Task *task)

{
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Var1;
  ExtTask *pEVar2;
  WorkerP *self_00;
  Task *pTVar3;
  bool bVar4;
  ExtTask *local_50;
  ExtTask *exp;
  undefined1 local_40 [8];
  ExtTask et;
  WorkerP *self;
  Task *task_local;
  
  self_00 = lace_get_worker();
  et.sem._24_8_ = self_00;
  if (self_00 == (WorkerP *)0x0) {
    lace_resume();
    (task->thief)._M_b._M_p = (__pointer_type)0x0;
    local_40 = (undefined1  [8])task;
    sem_init((sem_t *)&et,0,0);
    pthread_mutex_lock((pthread_mutex_t *)&external_task_lock);
    while (external_task_exclusive != 0) {
      pthread_cond_wait((pthread_cond_t *)&external_task_cond,(pthread_mutex_t *)&external_task_lock
                       );
    }
    external_task_counter = external_task_counter + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&external_task_lock);
    local_50 = (ExtTask *)0x0;
    do {
      LOCK();
      bVar4 = local_50 != external_task;
      pEVar2 = (ExtTask *)local_40;
      if (bVar4) {
        local_50 = external_task;
        pEVar2 = external_task;
      }
      external_task = pEVar2;
      UNLOCK();
    } while (bVar4);
    sem_wait((sem_t *)&et);
    sem_destroy((sem_t *)&et);
    pthread_mutex_lock((pthread_mutex_t *)&external_task_lock);
    external_task_counter = external_task_counter + -1;
    if ((external_task_exclusive != 0) && (external_task_counter == 0)) {
      pthread_cond_broadcast((pthread_cond_t *)&external_task_cond);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&external_task_lock);
    lace_suspend();
  }
  else {
    p_Var1 = task->f;
    pTVar3 = lace_get_head(self_00);
    (*p_Var1)(self_00,pTVar3,task);
  }
  return;
}

Assistant:

void
lace_run_task(Task *task)
{
    // check if we are really not in a Lace thread
    WorkerP* self = lace_get_worker();
    if (self != 0) {
        task->f(self, lace_get_head(self), task);
    } else {
        // if needed, wake up the workers
        lace_resume();

        ExtTask et;
        et.task = task;
        atomic_store_explicit(&et.task->thief, 0, memory_order_relaxed);
        sem_init(&et.sem, 0, 0);

        pthread_mutex_lock(&external_task_lock);
        while (external_task_exclusive) {
            // if "exclusive" is set, then we wait until we can continue
            pthread_cond_wait(&external_task_cond, &external_task_lock);
        }
        external_task_counter++;
        pthread_mutex_unlock(&external_task_lock);

        ExtTask *exp = 0;
        while (atomic_compare_exchange_weak(&external_task, &exp, &et) != 1) {}

        sem_wait(&et.sem);
        sem_destroy(&et.sem);

        pthread_mutex_lock(&external_task_lock);
        external_task_counter--;
        if (external_task_exclusive && external_task_counter == 0) {
            // if counter is 0 and exclusive is set, then we should wake up the threads
            pthread_cond_broadcast(&external_task_cond);
        }
        pthread_mutex_unlock(&external_task_lock);

        // allow Lace workers to sleep again
        lace_suspend();
    }
}